

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O0

bool Kernel::MatchingUtils::match<Inferences::FastCondensation::CondensationBinder>
               (Literal *base,Literal *instance,bool complementary,CondensationBinder *binder)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined1 in_DL;
  Literal *in_RSI;
  Term *in_RDI;
  undefined7 in_stack_00000008;
  CondensationBinder *in_stack_00000068;
  Term *in_stack_00000070;
  Term *in_stack_00000078;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  bVar1 = Literal::headersMatch
                    (in_RSI,(Literal *)
                            (CONCAT17(in_DL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
                     SUB81((ulong)in_RCX >> 0x38,0));
  if (bVar1) {
    uVar2 = Term::arity(in_RDI);
    if (uVar2 == 0) {
      local_1 = true;
    }
    else {
      Inferences::FastCondensation::CondensationBinder::reset((CondensationBinder *)0x7b054f);
      bVar1 = Literal::isEquality((Literal *)0x7b0559);
      if (bVar1) {
        bVar1 = matchArgs<Inferences::FastCondensation::CondensationBinder>
                          (in_stack_00000078,in_stack_00000070,in_stack_00000068);
        if (bVar1) {
          local_1 = true;
        }
        else {
          Inferences::FastCondensation::CondensationBinder::reset((CondensationBinder *)0x7b0588);
          local_1 = matchReversedArgs<Inferences::FastCondensation::CondensationBinder>
                              (base,instance,
                               (CondensationBinder *)CONCAT17(complementary,in_stack_00000008));
        }
      }
      else {
        local_1 = matchArgs<Inferences::FastCondensation::CondensationBinder>
                            (in_stack_00000078,in_stack_00000070,in_stack_00000068);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool match(Literal* base, Literal* instance, bool complementary, Binder& binder)
  {
    if(!Literal::headersMatch(base,instance,complementary)) {
      return false;
    }

    if(base->arity()==0) {
      return true;
    }

    binder.reset();

    if(base->isEquality()) {
      ASS_EQ(base->arity(), 2);
      if(matchArgs(base, instance, binder)) {
        return true;
      }
      binder.reset();
      return matchReversedArgs(base, instance, binder);
    } else {
      return matchArgs(base, instance, binder);
    }
  }